

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

void output_versions(void)

{
  byte local_16;
  byte local_15;
  byte local_14;
  byte local_13;
  byte local_12;
  byte local_11;
  PHYSFS_Version linked;
  PHYSFS_Version compiled;
  
  local_13 = 3;
  local_12 = 0;
  local_11 = 1;
  PHYSFS_getLinkedVersion(&local_16);
  printf("test_physfs version %d.%d.%d.\n Compiled against PhysicsFS version %d.%d.%d,\n and linked against %d.%d.%d.\n\n"
         ,3,0,1,(ulong)local_13,(ulong)local_12,(uint)local_11,(uint)local_16,(uint)local_15,
         (uint)local_14);
  return;
}

Assistant:

static void output_versions(void)
{
    PHYSFS_Version compiled;
    PHYSFS_Version linked;

    PHYSFS_VERSION(&compiled);
    PHYSFS_getLinkedVersion(&linked);

    printf("test_physfs version %d.%d.%d.\n"
           " Compiled against PhysicsFS version %d.%d.%d,\n"
           " and linked against %d.%d.%d.\n\n",
            TEST_VERSION_MAJOR, TEST_VERSION_MINOR, TEST_VERSION_PATCH,
            (int) compiled.major, (int) compiled.minor, (int) compiled.patch,
            (int) linked.major, (int) linked.minor, (int) linked.patch);
}